

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_validate(lyd_node **node,int options,void *var_arg,...)

{
  undefined8 uVar1;
  char in_AL;
  int iVar2;
  int iVar3;
  lyd_node *plVar4;
  lyd_difflist **in_RCX;
  void *pvVar5;
  char *format;
  ly_ctx *data_tree;
  undefined8 in_R8;
  undefined8 in_R9;
  lyd_difflist **diff;
  bool bVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  lyd_difflist **local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  va_list ap;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  iVar3 = 1;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  if (node == (lyd_node **)0x0) {
LAB_001658b1:
    format = "Invalid arguments (%s()).";
LAB_001658b8:
    var_arg = (ly_ctx *)0x0;
LAB_001658c4:
    ly_log((ly_ctx *)var_arg,LY_LLERR,LY_EINVAL,format,"lyd_validate");
  }
  else {
    iVar2 = lyp_data_check_options((ly_ctx *)0x0,options,"lyd_validate");
    if (iVar2 != 0) {
      return 1;
    }
    plVar4 = *node;
    if (plVar4 == (lyd_node *)0x0 && ((options & 0xfU) != 0 || (options & 0x10000ffU) == 0)) {
      if (var_arg == (void *)0x0) {
        format = "%s: invalid variable parameter (struct ly_ctx *ctx).";
        goto LAB_001658b8;
      }
      options = options & 0xffffefff;
      data_tree = (ly_ctx *)(lyd_node *)0x0;
    }
    else if ((options & 0x70U) == 0) {
      var_arg = (ly_ctx *)0x0;
      bVar6 = ((uint)options >> 0x18 & 1) != 0;
      data_tree = (ly_ctx *)plVar4;
      if (bVar6) {
        data_tree = (ly_ctx *)var_arg;
      }
      if (bVar6 && plVar4 != (lyd_node *)0x0) {
        if ((plVar4->prev->next != (lyd_node *)0x0) || (plVar4->next != (lyd_node *)0x0)) {
          format = "%s: invalid variable parameter (struct lyd_node *node).";
          goto LAB_001658b8;
        }
        var_arg = (ly_ctx *)0x0;
        data_tree = (ly_ctx *)plVar4;
      }
    }
    else {
      if (((uint)options >> 0xc & 1) != 0) {
        format = 
        "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS)."
        ;
        goto LAB_001658b8;
      }
      if (plVar4 == (lyd_node *)0x0) goto LAB_001658b1;
      if (var_arg == (void *)0x0) {
        data_tree = (ly_ctx *)0x0;
      }
      else {
        pvVar5 = var_arg;
        if ((short)options < 0) {
          format = 
          "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set)."
          ;
          goto LAB_001658b8;
        }
        for (; pvVar5 != (void *)0x0; pvVar5 = *(void **)((long)pvVar5 + 0x18)) {
          if (*(long *)((long)pvVar5 + 0x28) != 0) {
            format = "%s: invalid variable parameter (const struct lyd_node *data_tree).";
            goto LAB_001658b8;
          }
        }
        do {
          data_tree = (ly_ctx *)var_arg;
          var_arg = ((lyd_node *)data_tree)->prev;
        } while (((lyd_node *)data_tree)->prev->next != (lyd_node *)0x0);
      }
      var_arg = (ly_ctx *)0x0;
    }
    if (((uint)options >> 0x12 & 1) == 0) {
      diff = (lyd_difflist **)0x0;
    }
    else {
      ap[0].overflow_arg_area = local_f8;
      ap[0]._0_8_ = &stack0x00000008;
      local_48 = 0x3000000020;
      uVar1 = local_48;
      local_48 = 0x3000000020;
      if (local_e0 == (lyd_difflist **)0x0) {
        format = "%s: invalid variable parameter (struct lyd_difflist **).";
        local_48 = uVar1;
        goto LAB_001658c4;
      }
      plVar4 = *node;
      diff = local_e0;
    }
    if (plVar4 != (lyd_node *)0x0) {
      if ((ly_ctx *)var_arg == (ly_ctx *)0x0) {
        var_arg = plVar4->schema->module->ctx;
      }
      if (((uint)options >> 0xc & 1) == 0) {
        while (plVar4 = plVar4->prev, plVar4->next != (lyd_node *)0x0) {
          *node = plVar4;
        }
      }
    }
    iVar3 = _lyd_validate(node,(lyd_node *)data_tree,(ly_ctx *)var_arg,(lys_module **)0x0,0,diff,
                          options);
  }
  return iVar3;
}

Assistant:

static int
_lyd_validate(struct lyd_node **node, struct lyd_node *data_tree, struct ly_ctx *ctx, const struct lys_module **modules,
              int mod_count, struct lyd_difflist **diff, int options)
{
    struct lyd_node *root, *next1, *next2, *iter, *act_notif = NULL;
    int ret = EXIT_FAILURE;
    unsigned int i;
    struct unres_data *unres = NULL;
    const struct lys_module *yanglib_mod;

    unres = calloc(1, sizeof *unres);
    LY_CHECK_ERR_RETURN(!unres, LOGMEM(NULL), EXIT_FAILURE);

    if (diff) {
        unres->store_diff = 1;
        unres->diff = lyd_diff_init_difflist(ctx, &unres->diff_size);
    }

    if ((options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY)) && *node && ((*node)->schema->nodetype != LYS_RPC)) {
        options |= LYD_OPT_ACT_NOTIF;
    }
    if ((options & (LYD_OPT_NOTIF | LYD_OPT_NOTIF_FILTER)) && *node && ((*node)->schema->nodetype != LYS_NOTIF)) {
        options |= LYD_OPT_ACT_NOTIF;
    }

    LY_TREE_FOR_SAFE(*node, next1, root) {
        if (modules) {
            for (i = 0; i < (unsigned)mod_count; ++i) {
                if (lyd_node_module(root) == modules[i]) {
                    break;
                }
            }
            if (i == (unsigned)mod_count) {
                /* skip data that should not be validated */
                continue;
            }
        }

        LY_TREE_DFS_BEGIN(root, next2, iter) {
            if (iter->parent && (iter->schema->nodetype & (LYS_ACTION | LYS_NOTIF))) {
                if (!(options & LYD_OPT_ACT_NOTIF) || act_notif) {
                    LOGVAL(ctx, LYE_INELEM, LY_VLOG_LYD, iter, iter->schema->name);
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Unexpected %s node \"%s\".",
                           (options & LYD_OPT_RPC ? "action" : "notification"), iter->schema->name);
                    goto cleanup;
                }
                act_notif = iter;
            }

            if (lyv_data_context(iter, options, unres) || lyv_data_content(iter, options, unres)) {
                goto cleanup;
            }

            /* empty non-default, non-presence container without attributes, make it default */
            if (!iter->dflt && (iter->schema->nodetype == LYS_CONTAINER) && !iter->child
                        && !((struct lys_node_container *)iter->schema)->presence && !iter->attr) {
                iter->dflt = 1;
            }

            LY_TREE_DFS_END(root, next2, iter);
        }

        if (options & LYD_OPT_NOSIBLINGS) {
            break;
        }

    }

    if (options & LYD_OPT_ACT_NOTIF) {
        if (!act_notif) {
            LOGVAL(ctx, LYE_MISSELEM, LY_VLOG_LYD, *node, (options & LYD_OPT_RPC ? "action" : "notification"), (*node)->schema->name);
            goto cleanup;
        }
        options &= ~LYD_OPT_ACT_NOTIF;
    }

    if (*node) {
        /* check for uniqueness of top-level lists/leaflists because
         * only the inner instances were tested in lyv_data_content() */
        yanglib_mod = ly_ctx_get_module(ctx ? ctx : (*node)->schema->module->ctx, "ietf-yang-library", NULL, 1);
        LY_TREE_FOR(*node, root) {
            if ((options & LYD_OPT_DATA_ADD_YANGLIB) && yanglib_mod && (root->schema->module == yanglib_mod)) {
                /* ietf-yang-library data present, so ignore the option to add them */
                options &= ~LYD_OPT_DATA_ADD_YANGLIB;
            }

            if (!(root->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) || !(root->validity & LYD_VAL_DUP)) {
                continue;
            }

            if (options & LYD_OPT_TRUSTED) {
                /* just clear the flag */
                root->validity &= ~LYD_VAL_DUP;
                continue;
            }

            if (lyv_data_dup(root, *node)) {
                goto cleanup;
            }
        }
    }

    /* add missing ietf-yang-library if requested */
    if (options & LYD_OPT_DATA_ADD_YANGLIB) {
        if (!(*node)) {
            (*node) = ly_ctx_info(ctx);
        } else if (lyd_merge((*node), ly_ctx_info(ctx), LYD_OPT_DESTRUCT | LYD_OPT_EXPLICIT)) {
            LOGERR(ctx, LY_EINT, "Adding ietf-yang-library data failed.");
            goto cleanup;
        }
    }

    /* add default values, resolve unres and check for mandatory nodes in final tree */
    if (lyd_defaults_add_unres(node, options, ctx, modules, mod_count, data_tree, act_notif, unres, 1)) {
        goto cleanup;
    }
    if (act_notif) {
        if (lyd_check_mandatory_tree(act_notif, ctx, modules, mod_count, options)) {
            goto cleanup;
        }
    } else {
        if (lyd_check_mandatory_tree(*node, ctx, modules, mod_count, options)) {
            goto cleanup;
        }
    }

    /* consolidate diff if created */
    if (diff) {
        assert(unres->store_diff);

        for (i = 0; i < unres->diff_idx; ++i) {
            if (unres->diff->type[i] == LYD_DIFF_CREATED) {
                if (unres->diff->second[i]->parent) {
                    unres->diff->first[i] = (struct lyd_node *)lyd_path(unres->diff->second[i]->parent);
                }
                unres->diff->second[i] = lyd_dup(unres->diff->second[i], LYD_DUP_OPT_RECURSIVE);
            }
        }

        *diff = unres->diff;
        unres->diff = 0;
        unres->diff_idx = 0;
    }

    ret = EXIT_SUCCESS;

cleanup:
    if (unres) {
        free(unres->node);
        free(unres->type);
        for (i = 0; i < unres->diff_idx; ++i) {
            if (unres->diff->type[i] == LYD_DIFF_DELETED) {
                lyd_free_withsiblings(unres->diff->first[i]);
                free(unres->diff->second[i]);
            }
        }
        lyd_free_diff(unres->diff);
        free(unres);
    }

    return ret;
}